

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regex.cpp
# Opt level: O3

int re_search(re_pattern_buffer *__buffer,char *__string,int __length,int __start,int __range,
             re_registers *__regs)

{
  char *pcVar1;
  size_type sVar2;
  char cVar3;
  string_type *other;
  char cVar4;
  bool bVar5;
  int iVar6;
  int extraout_EAX;
  size_t sVar7;
  ostream *poVar8;
  runtime_error *prVar9;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  string *s;
  smatch sm;
  ostringstream oss;
  smatch local_208;
  string *local_1e0;
  string local_1d8 [32];
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8 [16];
  string_type *local_38;
  
  s = (string *)CONCAT44(in_register_00000014,__length);
  cVar3 = (char)__buffer;
  local_1e0 = (string *)__string;
  booster::regex::regex((regex *)local_1b8,(string *)__string,0);
  pcVar1 = (s->_M_dataplus)._M_p;
  cVar4 = booster::regex::search((char *)local_1b8,pcVar1,(int)s->_M_string_length + (int)pcVar1);
  local_38 = (string_type *)CONCAT44(in_register_0000000c,__start);
  booster::regex::~regex((regex *)local_1b8);
  if (cVar4 != cVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,0x82);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," booster::regex_search(pat,booster::regex(re))==result",0x36);
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&local_208);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar1 = (s->_M_dataplus)._M_p;
  sVar2 = s->_M_string_length;
  booster::regex::regex((regex *)local_1b8,local_1e0,0);
  cVar4 = booster::regex::search((char *)local_1b8,pcVar1,(int)sVar2 + (int)pcVar1);
  booster::regex::~regex((regex *)local_1b8);
  if (cVar4 != cVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,0x83);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               " booster::regex_search(pat.c_str(),pat.c_str()+pat.size(),booster::regex(re))==result"
               ,0x55);
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&local_208);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar1 = (s->_M_dataplus)._M_p;
  booster::regex::regex((regex *)local_1b8,local_1e0,0);
  sVar7 = strlen(pcVar1);
  cVar4 = booster::regex::search((char *)local_1b8,pcVar1,(int)sVar7 + (int)pcVar1);
  iVar6 = booster::regex::~regex((regex *)local_1b8);
  other = local_38;
  if (cVar4 != cVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,0x84);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," booster::regex_search(pat.c_str(),booster::regex(re))==result",0x3e);
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&local_208);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (cVar3 != '\0') {
    local_208.offsets_.
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_208.offsets_.
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_208.begin_._M_current = (char *)0x0;
    local_208.end_._M_current = (char *)0x0;
    local_208.offsets_.
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    booster::regex::regex((regex *)local_1b8,local_1e0,0);
    bVar5 = booster::regex_search<booster::regex>(s,&local_208,(regex *)local_1b8,0);
    booster::regex::~regex((regex *)local_1b8);
    if (!bVar5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                 ,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,0x89);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8," booster::regex_search(pat,sm,booster::regex(re))",0x31);
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar9,local_1d8);
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_1b8[0].
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .first._M_current = (char *)0x0;
    local_1b8[0].
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .second._M_current = (char *)0x0;
    local_1b8[0].matched = false;
    if ((-1 < __range) &&
       (__range < (int)((ulong)((long)local_208.offsets_.
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_208.offsets_.
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3))) {
      if ((long)local_208.offsets_.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start[(uint)__range].first != -1) {
        local_1b8[0].matched = true;
        local_1b8[0].
        super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .first._M_current =
             local_208.begin_._M_current +
             local_208.offsets_.
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start[(uint)__range].first;
        local_1b8[0].
        super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .second._M_current =
             local_208.begin_._M_current +
             local_208.offsets_.
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start[(uint)__range].second;
      }
    }
    iVar6 = booster::
            sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::compare(local_1b8,other);
    if (iVar6 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                 ,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,0x8a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," sm[pos]==key",0xd);
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar9,local_1d8);
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_208.offsets_.
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_208.offsets_.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    local_208.offsets_.
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_208.offsets_.
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_208.begin_._M_current = (char *)0x0;
    local_208.end_._M_current = (char *)0x0;
    local_208.offsets_.
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar1 = (s->_M_dataplus)._M_p;
    sVar2 = s->_M_string_length;
    booster::regex::regex((regex *)local_1b8,local_1e0,0);
    bVar5 = booster::regex_search<booster::regex>
                      (pcVar1,pcVar1 + sVar2,(cmatch *)&local_208,(regex *)local_1b8,0);
    booster::regex::~regex((regex *)local_1b8);
    if (!bVar5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                 ,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,0x8e);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,
                 " booster::regex_search(pat.c_str(),pat.c_str()+pat.size(),cm,booster::regex(re))",
                 0x50);
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar9,local_1d8);
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_1b8[0].
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .first._M_current = (char *)0x0;
    local_1b8[0].
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .second._M_current = (char *)0x0;
    local_1b8[0].matched = false;
    if ((-1 < __range) &&
       (__range < (int)((ulong)((long)local_208.offsets_.
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_208.offsets_.
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3))) {
      if ((long)local_208.offsets_.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start[(uint)__range].first != -1) {
        local_1b8[0].matched = true;
        local_1b8[0].
        super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .first._M_current =
             local_208.begin_._M_current +
             local_208.offsets_.
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start[(uint)__range].first;
        local_1b8[0].
        super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .second._M_current =
             local_208.begin_._M_current +
             local_208.offsets_.
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start[(uint)__range].second;
      }
    }
    iVar6 = booster::sub_match<const_char_*>::compare((sub_match<const_char_*> *)local_1b8,other);
    if (iVar6 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                 ,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,0x8f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," cm[pos]==key",0xd);
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar9,local_1d8);
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_208.offsets_.
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_208.offsets_.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    local_208.offsets_.
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_208.offsets_.
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_208.begin_._M_current = (char *)0x0;
    local_208.end_._M_current = (char *)0x0;
    local_208.offsets_.
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar1 = (s->_M_dataplus)._M_p;
    booster::regex::regex((regex *)local_1b8,local_1e0,0);
    bVar5 = booster::regex_search<booster::regex>(pcVar1,(cmatch *)&local_208,(regex *)local_1b8,0);
    booster::regex::~regex((regex *)local_1b8);
    if (!bVar5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                 ,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,0x93);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8," booster::regex_search(pat.c_str(),cm,booster::regex(re))",0x39);
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar9,local_1d8);
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_1b8[0].
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .first._M_current = (char *)0x0;
    local_1b8[0].
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .second._M_current = (char *)0x0;
    local_1b8[0].matched = false;
    if ((-1 < __range) &&
       (__range < (int)((ulong)((long)local_208.offsets_.
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_208.offsets_.
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3))) {
      if ((long)local_208.offsets_.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start[(uint)__range].first != -1) {
        local_1b8[0].matched = true;
        local_1b8[0].
        super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .first._M_current =
             local_208.begin_._M_current +
             local_208.offsets_.
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start[(uint)__range].first;
        local_1b8[0].
        super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .second._M_current =
             local_208.begin_._M_current +
             local_208.offsets_.
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start[(uint)__range].second;
      }
    }
    iVar6 = booster::sub_match<const_char_*>::compare((sub_match<const_char_*> *)local_1b8,other);
    if (iVar6 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                 ,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,0x94);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," cm[pos]==key",0xd);
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar9,local_1d8);
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar6 = 0;
    if (local_208.offsets_.
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_208.offsets_.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      iVar6 = extraout_EAX;
    }
  }
  return iVar6;
}

Assistant:

void re_search(bool result,std::string re,std::string pat,std::string key="",int pos=0)
{
	TEST(booster::regex_search(pat,booster::regex(re))==result);
	TEST(booster::regex_search(pat.c_str(),pat.c_str()+pat.size(),booster::regex(re))==result);
	TEST(booster::regex_search(pat.c_str(),booster::regex(re))==result);

	if(result) {
		{
			booster::smatch sm;
			TEST(booster::regex_search(pat,sm,booster::regex(re)));
			TEST(sm[pos]==key);
		}
		{
			booster::cmatch cm;
			TEST(booster::regex_search(pat.c_str(),pat.c_str()+pat.size(),cm,booster::regex(re)));
			TEST(cm[pos]==key);
		}
		{
			booster::cmatch cm;
			TEST(booster::regex_search(pat.c_str(),cm,booster::regex(re)));
			TEST(cm[pos]==key);
		}
	}
}